

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.hpp
# Opt level: O0

TestInstance * __thiscall
vkt::texture::util::
TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMaxLevelTestInstance>::createInstance
          (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMaxLevelTestInstance> *this
          ,Context *context)

{
  Texture3DMaxLevelTestInstance *this_00;
  Context *context_local;
  TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMaxLevelTestInstance> *this_local;
  
  this_00 = (Texture3DMaxLevelTestInstance *)operator_new(800);
  texture::anon_unknown_0::Texture3DMaxLevelTestInstance::Texture3DMaxLevelTestInstance
            (this_00,context,&this->m_testsParameters);
  return (TestInstance *)this_00;
}

Assistant:

virtual TestInstance*				createInstance				(Context& context) const
										{
											return new INSTANCE_TYPE(context, m_testsParameters);
										}